

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O2

void __thiscall iqxmlrpc::Server::push_interceptor(Server *this,Interceptor *ic)

{
  Interceptor *p;
  
  p = (this->impl->interceptors)._M_ptr;
  (this->impl->interceptors)._M_ptr = (Interceptor *)0x0;
  boost::scoped_ptr<iqxmlrpc::Interceptor>::reset((scoped_ptr<iqxmlrpc::Interceptor> *)(ic + 8),p);
  std::auto_ptr<iqxmlrpc::Interceptor>::reset(&this->impl->interceptors,ic);
  return;
}

Assistant:

void Server::push_interceptor(Interceptor* ic)
{
  ic->nest(impl->interceptors.release());
  impl->interceptors.reset(ic);
}